

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::WriteXMLGlobal(cmCTestSVN *this,cmXMLWriter *xml)

{
  cmXMLWriter *this_00;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestSVN *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  cmCTestGlobalVC::WriteXMLGlobal(&this->super_cmCTestGlobalVC,xml);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SVNPath",&local_39);
  cmXMLWriter::Element<std::__cxx11::string>(this_00,&local_38,&this->RootInfo->Base);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmCTestSVN::WriteXMLGlobal(cmXMLWriter& xml)
{
  this->cmCTestGlobalVC::WriteXMLGlobal(xml);

  xml.Element("SVNPath", this->RootInfo->Base);
}